

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_group_set_scroll(nk_context *ctx,char *id,nk_uint x_offset,nk_uint y_offset)

{
  uint uVar1;
  nk_window *win;
  nk_table *pnVar2;
  long lVar3;
  nk_hash name;
  long lVar4;
  nk_uint *pnVar5;
  nk_uint *pnVar6;
  nk_table *pnVar7;
  ulong uVar8;
  
  if ((((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
      (id != (char *)0x0)) && (win->layout != (nk_panel *)0x0)) {
    if (*id == '\0') {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        lVar3 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (id[lVar3] != '\0');
    }
    name = nk_murmur_hash(id,(int)lVar4,2);
    pnVar7 = win->tables;
    for (pnVar2 = pnVar7; pnVar2 != (nk_table *)0x0; pnVar2 = pnVar2->next) {
      uVar8 = (ulong)pnVar2->size;
      if (uVar8 != 0) {
        pnVar5 = pnVar2->values;
        do {
          if (pnVar5[-0x3b] == name) {
            uVar1 = win->seq;
            pnVar2->seq = uVar1;
            goto LAB_0011eee2;
          }
          pnVar5 = pnVar5 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
    }
    pnVar5 = nk_add_value(ctx,win,name,(nk_uint)pnVar7);
    pnVar6 = nk_add_value(ctx,win,name + 1,(nk_uint)pnVar7);
    if (pnVar6 != (nk_uint *)0x0 && pnVar5 != (nk_uint *)0x0) {
      *pnVar6 = 0;
      *pnVar5 = 0;
LAB_0011ef0e:
      *pnVar5 = x_offset;
      *pnVar6 = y_offset;
    }
  }
  return;
LAB_0011eee2:
  uVar8 = (ulong)pnVar7->size;
  if (uVar8 != 0) {
    pnVar6 = pnVar7->values;
    do {
      if (pnVar6[-0x3b] == name + 1) {
        pnVar7->seq = uVar1;
        goto LAB_0011ef0e;
      }
      pnVar6 = pnVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  pnVar7 = pnVar7->next;
  goto LAB_0011eee2;
}

Assistant:

NK_API void
nk_group_set_scroll(struct nk_context *ctx, const char *id, nk_uint x_offset, nk_uint y_offset)
{
int id_len;
nk_hash id_hash;
struct nk_window *win;
nk_uint *x_offset_ptr;
nk_uint *y_offset_ptr;

NK_ASSERT(ctx);
NK_ASSERT(id);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !id)
return;

/* find persistent group scrollbar value */
win = ctx->current;
id_len = (int)nk_strlen(id);
id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
x_offset_ptr = nk_find_value(win, id_hash);
if (!x_offset_ptr) {
x_offset_ptr = nk_add_value(ctx, win, id_hash, 0);
y_offset_ptr = nk_add_value(ctx, win, id_hash+1, 0);

NK_ASSERT(x_offset_ptr);
NK_ASSERT(y_offset_ptr);
if (!x_offset_ptr || !y_offset_ptr) return;
*x_offset_ptr = *y_offset_ptr = 0;
} else y_offset_ptr = nk_find_value(win, id_hash+1);
*x_offset_ptr = x_offset;
*y_offset_ptr = y_offset;
}